

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_print(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid,char *description)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *__format;
  int iVar5;
  long lVar6;
  double dVar7;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)ref_histogram->nbin;
  if (ref_histogram->nbin < 1) {
    uVar2 = uVar3;
  }
  uVar4 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = uVar4 + ref_histogram->bins[uVar3];
  }
  printf("%7.3f %10.3e min %s\n",ref_histogram->min,ref_histogram->min,description);
  lVar6 = 0;
  do {
    if (ref_histogram->nbin <= lVar6) {
      printf("%7.3f %10.3e:%10d max %s\n",ref_histogram->max,ref_histogram->max,(ulong)uVar4,
             description);
      exp2(ref_histogram->log_total / (double)(int)uVar4);
      printf("%18.10f mean %s\n",description);
      return 0;
    }
    iVar5 = (int)lVar6;
    dVar7 = exp2((double)(ref_histogram->nbin / -2 + iVar5 + 1) * (1.0 / ref_histogram->exp));
    if (ref_histogram->min <= dVar7 && dVar7 != ref_histogram->min) {
      dVar7 = exp2((double)(ref_histogram->nbin / -2 + iVar5 + -1) * (1.0 / ref_histogram->exp));
      if (dVar7 < ref_histogram->max) {
        dVar7 = exp2((double)(ref_histogram->nbin / -2 + iVar5) * (1.0 / ref_histogram->exp));
        pRVar1 = &ref_grid->adapt->split_ratio;
        if (*pRVar1 <= dVar7 && dVar7 != *pRVar1) {
LAB_001a6413:
          __format = "%7.3f:%10d *\n";
          if (ref_histogram->bins[lVar6] < 1) goto LAB_001a6425;
        }
        else {
          dVar7 = exp2((double)(ref_histogram->nbin / -2 + iVar5 + -1) * (1.0 / ref_histogram->exp))
          ;
          if (dVar7 < ref_grid->adapt->collapse_ratio) goto LAB_001a6413;
LAB_001a6425:
          __format = "%7.3f:%10d\n";
        }
        exp2((double)(ref_histogram->nbin / -2 + iVar5) * (1.0 / ref_histogram->exp));
        printf(__format,(ulong)(uint)ref_histogram->bins[lVar6]);
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_histogram_print(REF_HISTOGRAM ref_histogram,
                                       REF_GRID ref_grid,
                                       const char *description) {
  REF_INT i, sum;
  REF_DBL log_mean;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);

  printf("%7.3f %10.3e min %s\n", ref_histogram_min(ref_histogram),
         ref_histogram_min(ref_histogram), description);

  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    if (ref_histogram_to_obs(i + 1) > ref_histogram_min(ref_histogram) &&
        ref_histogram_to_obs(i - 1) < ref_histogram_max(ref_histogram)) {
      if ((ref_histogram_to_obs(i) > ref_grid_adapt(ref_grid, split_ratio) ||
           ref_histogram_to_obs(i - 1) <
               ref_grid_adapt(ref_grid, collapse_ratio)) &&
          ref_histogram_bin(ref_histogram, i) > 0) {
        printf("%7.3f:%10d *\n", ref_histogram_to_obs(i),
               ref_histogram_bin(ref_histogram, i));
      } else {
        printf("%7.3f:%10d\n", ref_histogram_to_obs(i),
               ref_histogram_bin(ref_histogram, i));
      }
    }

  printf("%7.3f %10.3e:%10d max %s\n", ref_histogram_max(ref_histogram),
         ref_histogram_max(ref_histogram), sum, description);
  log_mean = ref_histogram_log_total(ref_histogram) / (REF_DBL)sum;
  printf("%18.10f mean %s\n", pow(2.0, log_mean), description);

  return REF_SUCCESS;
}